

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_28494c::CAPIBuildSystemFrontendDelegate::error
          (CAPIBuildSystemFrontendDelegate *this,StringRef filename,Token *at,Twine *message)

{
  _func_void_void_ptr_llb_buildsystem_diagnostic_kind_t_char_ptr_int_int_char_ptr *p_Var1;
  void *pvVar2;
  char *pcVar3;
  char *local_68;
  undefined8 local_60;
  char local_58;
  undefined7 uStack_57;
  string local_48;
  
  pcVar3 = filename.Data;
  p_Var1 = (this->cAPIDelegate).handle_diagnostic;
  if (p_Var1 != (_func_void_void_ptr_llb_buildsystem_diagnostic_kind_t_char_ptr_int_int_char_ptr *)
                0x0) {
    pvVar2 = (this->cAPIDelegate).context;
    local_68 = &local_58;
    if (pcVar3 == (char *)0x0) {
      local_60 = 0;
      local_58 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,pcVar3,pcVar3 + filename.Length);
    }
    pcVar3 = local_68;
    llvm::Twine::str_abi_cxx11_(&local_48,message);
    (*p_Var1)(pvVar2,llb_buildsystem_diagnostic_kind_error,pcVar3,-1,-1,local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (local_68 != &local_58) {
      operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
    }
    return;
  }
  llbuild::buildsystem::BuildSystemFrontendDelegate::error
            (&this->super_BuildSystemFrontendDelegate,filename,at,message);
  return;
}

Assistant:

virtual void error(StringRef filename, const Token& at, const Twine& message) override {
    if (cAPIDelegate.handle_diagnostic) {
      cAPIDelegate.handle_diagnostic(cAPIDelegate.context,
                                     llb_buildsystem_diagnostic_kind_error,
                                     filename.str().c_str(),
                                     -1,
                                     -1,
                                     message.str().c_str());
    } else {
        BuildSystemFrontendDelegate::error(filename, at, message);
    }
  }